

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexTriangleFilter::applyIter
          (PtexTriangleFilter *this,PtexTriangleKernelIter *k,PtexFaceData *dh)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  PtexFaceData *pPVar5;
  PtexTriangleKernelIter *this_00;
  undefined4 extraout_var;
  DataType dt;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  PtexPtr<Ptex::v2_2::PtexFaceData> th;
  int wOffset;
  int uOffset;
  int tileuEnd;
  int tileu;
  int vOffset;
  int tilevEnd;
  int tilev;
  int wOffsetBase;
  int ntilesu;
  int tileresv;
  int tileresu;
  PtexTriangleKernelIter kt;
  Res tileres;
  PtexPtr<Ptex::v2_2::PtexFaceData> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  void *data;
  float *in_stack_ffffffffffffff08;
  PtexTriangleKernelIter *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 uVar6;
  void *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  PtexTriangleKernelIter *in_stack_ffffffffffffff30;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  float local_54;
  float local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  float local_20;
  Res local_1a;
  long *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = (**(code **)(*in_RDX + 0x18))();
  if ((uVar4 & 1) == 0) {
    uVar4 = (**(code **)(*local_18 + 0x38))();
    if ((uVar4 & 1) == 0) {
      iVar3 = (int)((ulong)*(undefined8 *)(in_RDI + 0x28) >> 0x20);
      (**(code **)(*local_18 + 0x30))();
      PtexTriangleKernelIter::apply
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (DataType)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8
                 ,iVar3);
      *(float *)(in_RDI + 0x30) = (float)local_10[0xe] + *(float *)(in_RDI + 0x30);
    }
    else {
      local_1a = (Res)(**(code **)(*local_18 + 0x40))();
      memcpy(&local_58,local_10,0x3c);
      local_5c = Res::u(&local_1a);
      local_60 = Res::v(&local_1a);
      local_58 = local_5c;
      local_64 = *local_10 / local_5c;
      local_68 = *local_10 - local_5c;
      local_70 = (local_10[7] + -1) / local_60;
      for (local_6c = local_10[4] / local_60; local_6c <= local_70; local_6c = local_6c + 1) {
        local_74 = local_6c * local_60;
        local_50 = (float)local_10[2] - (float)local_74;
        local_48 = PtexUtils::max<int>(0,local_10[4] - local_74);
        local_3c = PtexUtils::min<int>(local_10[7] - local_74,local_60);
        local_7c = (local_10[6] + -1) / local_5c;
        for (local_78 = local_10[3] / local_5c; local_78 <= local_7c; local_78 = local_78 + 1) {
          local_80 = local_78 * local_5c;
          local_84 = (local_68 - local_80) - local_74;
          local_54 = (float)local_10[1] - (float)local_80;
          local_4c = PtexUtils::max<int>(0,local_10[3] - local_80);
          local_40 = PtexUtils::min<int>(local_10[6] - local_80,local_5c);
          local_44 = local_10[5] - local_84;
          local_38 = local_10[8] - local_84;
          pPVar5 = (PtexFaceData *)
                   (**(code **)(*local_18 + 0x48))(local_18,local_6c * local_64 + local_78);
          PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr(&local_90,pPVar5);
          pPVar5 = PtexPtr::operator_cast_to_PtexFaceData_((PtexPtr *)&local_90);
          if (pPVar5 != (PtexFaceData *)0x0) {
            local_20 = 0.0;
            this_00 = (PtexTriangleKernelIter *)
                      PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_90);
            uVar2 = (*(*(_func_int ***)this_00)[3])();
            uVar1 = (undefined1)uVar2;
            if ((uVar2 & 1) == 0) {
              data = *(void **)(in_RDI + 0x28);
              pPVar5 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_90);
              iVar3 = (*pPVar5->_vptr_PtexFaceData[6])();
              PtexTriangleKernelIter::apply
                        (in_stack_ffffffffffffff10,(float *)pPVar5,data,dt,iVar3,
                         (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
            }
            else {
              uVar6 = *(undefined8 *)(in_RDI + 0x28);
              pPVar5 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_90);
              iVar3 = (*pPVar5->_vptr_PtexFaceData[6])();
              in_stack_ffffffffffffff10 = (PtexTriangleKernelIter *)CONCAT44(extraout_var,iVar3);
              PtexTriangleKernelIter::applyConst
                        (this_00,(float *)CONCAT17(uVar1,in_stack_ffffffffffffff28),pPVar5,
                         (DataType)((ulong)uVar6 >> 0x20),(int)uVar6);
            }
            *(float *)(in_RDI + 0x30) = local_20 + *(float *)(in_RDI + 0x30);
          }
          PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(in_stack_fffffffffffffef0);
        }
      }
    }
  }
  else {
    (**(code **)(*local_18 + 0x30))();
    PtexTriangleKernelIter::applyConst
              (in_stack_ffffffffffffff30,
               (float *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,(DataType)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (int)in_stack_ffffffffffffff18);
    *(float *)(in_RDI + 0x30) = (float)local_10[0xe] + *(float *)(in_RDI + 0x30);
  }
  return;
}

Assistant:

void PtexTriangleFilter::applyIter(PtexTriangleKernelIter& k, PtexFaceData* dh)
{
    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        _weight += k.weight;
    }
    else if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexTriangleKernelIter kt = k;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        kt.rowlen = tileresu;
        int ntilesu = k.rowlen / kt.rowlen;
        int wOffsetBase = k.rowlen - tileresu;
        for (int tilev = k.v1 / tileresv, tilevEnd = (k.v2-1) / tileresv; tilev <= tilevEnd; tilev++) {
            int vOffset = tilev * tileresv;
            kt.v = k.v - (float)vOffset;
            kt.v1 = PtexUtils::max(0, k.v1 - vOffset);
            kt.v2 = PtexUtils::min(k.v2 - vOffset, tileresv);
            for (int tileu = k.u1 / tileresu, tileuEnd = (k.u2-1) / tileresu; tileu <= tileuEnd; tileu++) {
                int uOffset = tileu * tileresu;
                int wOffset = wOffsetBase - uOffset - vOffset;
                kt.u = k.u - (float)uOffset;
                kt.u1 = PtexUtils::max(0, k.u1 - uOffset);
                kt.u2 = PtexUtils::min(k.u2 - uOffset, tileresu);
                kt.w1 = k.w1 - wOffset;
                kt.w2 = k.w2 - wOffset;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    kt.weight = 0;
                    if (th->isConstant())
                        kt.applyConst(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                    _weight += kt.weight;
                }
            }
        }
    }
    else {
        k.apply(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
        _weight += k.weight;
    }
}